

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O0

void s16_to_float(void *ptr,long nsamp)

{
  float *dst;
  int16_t *src;
  long nsamp_local;
  void *ptr_local;
  
  dst = (float *)(nsamp * 4 + (long)ptr);
  src = (int16_t *)(nsamp * 2 + (long)ptr);
  nsamp_local = nsamp;
  while (0 < nsamp_local) {
    dst[-1] = (float)(int)src[-1] * 3.0517578e-05;
    dst = dst + -1;
    src = src + -1;
    nsamp_local = nsamp_local + -1;
  }
  return;
}

Assistant:

static void
s16_to_float(void * ptr, long nsamp)
{
  int16_t * src = ptr;
  float * dst = ptr;

  src += nsamp;
  dst += nsamp;
  while (nsamp-- > 0)
    *(--dst) = (1. / 32768) * *(--src);
}